

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

int CMU462::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  char cVar1;
  bool bVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *__s;
  double *pdVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  allocator<char> *paVar9;
  undefined8 *puVar10;
  byte bVar11;
  string up_dir;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  allocator<char> local_528 [128];
  XMLDocument doc;
  ifstream in;
  
  bVar11 = 0;
  std::ifstream::ifstream(&in,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Warning: could not open file ");
    poVar6 = std::operator<<(poVar6,filename);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar8 = -1;
LAB_00173588:
    std::ifstream::~ifstream(&in);
    return iVar8;
  }
  std::ifstream::close();
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile(&doc,filename);
  if (doc._errorID == XML_NO_ERROR) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"COLLADA");
    if (pXVar3 != (XMLElement *)0x0) {
      scene = sceneInfo;
      uri_load(pXVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"asset",local_528);
      pXVar4 = get_element(pXVar3,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      if (pXVar4 != (XMLElement *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"up_axis",local_528)
        ;
        pXVar4 = get_element(pXVar4,&local_568);
        std::__cxx11::string::~string((string *)&local_568);
        if (pXVar4 == (XMLElement *)0x0) goto LAB_001735b2;
        __s = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string<std::allocator<char>>((string *)&up_dir,__s,local_528);
        Matrix4x4::identity();
        paVar9 = local_528;
        puVar10 = &transform;
        for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar10 = *(undefined8 *)paVar9;
          paVar9 = paVar9 + ((ulong)bVar11 * -2 + 1) * 8;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        bVar2 = std::operator==(&up_dir,"X_UP");
        if (bVar2) {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,0);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,1);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,0);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,1);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,2);
          *pdVar5 = -1.0;
          up._0_8_ = 0x3ff0000000000000;
          up._8_8_ = 0;
          up._16_8_ = 0;
        }
        else {
          bVar2 = std::operator==(&up_dir,"Z_UP");
          if (bVar2) {
            pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,1);
            *pdVar5 = 0.0;
            pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,1,2);
            *pdVar5 = 1.0;
            pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,1);
            *pdVar5 = 1.0;
            pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,2,2);
            *pdVar5 = 0.0;
            pdVar5 = Matrix4x4::operator()((Matrix4x4 *)&transform,0,0);
            *pdVar5 = -1.0;
            up._0_8_ = 0;
            up._8_8_ = 0;
            up._16_8_ = 0x3ff0000000000000;
          }
          else {
            bVar2 = std::operator==(&up_dir,"Y_UP");
            if (!bVar2) goto LAB_001735b2;
            up._0_8_ = 0;
            up._8_8_ = 0x3ff0000000000000;
            up._16_8_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)&up_dir);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"scene/instance_visual_scene",local_528);
      pXVar3 = get_element(pXVar3,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      if (pXVar3 != (XMLElement *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"node",local_528);
        pXVar4 = get_element(pXVar3,&local_5a8);
        std::__cxx11::string::~string((string *)&local_5a8);
        for (; pXVar4 != (XMLElement *)0x0;
            pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
          parse_node(pXVar4);
        }
      }
      iVar8 = -(uint)(pXVar3 == (XMLElement *)0x0);
      tinyxml2::XMLDocument::~XMLDocument(&doc);
      goto LAB_00173588;
    }
  }
  else {
    tinyxml2::XMLDocument::PrintError(&doc);
  }
LAB_001735b2:
  exit(1);
}

Assistant:

int ColladaParser::load( const char* filename, SceneInfo* sceneInfo )
{
   ifstream in( filename );
   if (!in.is_open())
   {
      cerr << "Warning: could not open file " << filename << endl;
      return -1;
   } in.close();

   XMLDocument doc;
   doc.LoadFile(filename);
   if (doc.Error()) {
      stat("XML error: ");
      doc.PrintError();
      exit(EXIT_FAILURE);
   }

   // Check XML schema
   XMLElement* root = doc.FirstChildElement("COLLADA");
   if (!root) {
      stat("Error: not a COLLADA file!")
         exit(EXIT_FAILURE);
   } else {
      stat("Loading COLLADA file...");
   }

   // Set output scene pointer
   scene = sceneInfo;

   // Build uri table
   uri_load(root);

   // Load assets - correct up direction
   if (XMLElement* e_asset = get_element(root, "asset")) {
      XMLElement* up_axis = get_element(e_asset, "up_axis");
      if (!up_axis) {
         stat("Error: No up direction defined in COLLADA file");
         exit(EXIT_FAILURE);
      }

      // get up direction and correct non-Y_UP scenes by setting a non-identity
      // global entry transformation, assuming right hand coordinate system for
      // both input and output

      string up_dir = up_axis->GetText();
      transform = Matrix4x4::identity();
      if (up_dir == "X_UP") {

         // swap X-Y and negate Z
         transform(0,0) =  0; transform(0,1) = 1;
         transform(1,0) =  1; transform(1,1) = 0;
         transform(2,2) = -1;

         // local up direction for lights and cameras
         up = Vector3D(1,0,0);

      } else if (up_dir == "Z_UP") {

         // swap Z-Y matrix and negate X
         transform(1,1) =  0; transform(1,2) = 1;
         transform(2,1) =  1; transform(2,2) = 0;
         transform(0,0) = -1;

         // local up direction cameras
         up = Vector3D(0,0,1);

      } else if (up_dir == "Y_UP") {
         up = Vector3D(0,1,0); // no need to correct Y_UP as its used internally
      } else {
         stat("Error: invalid up direction in COLLADA file");
         exit(EXIT_FAILURE);
      }
   }

   // Load scene -
   // A scene should only have one visual_scene instance, this constraint
   // creates a one-to-one relationship between the document, the top-level
   // scene, and its visual description (COLLADA spec 1.4 page 91)
   if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {

      stat("Loading scene...");

      // parse all nodes in scene
      XMLElement* e_node = get_element(e_scene, "node");
      while (e_node) {
         parse_node(e_node);
         e_node = e_node->NextSiblingElement("node");
      }

   } else {
      stat("Error: No scene description found in file:" << filename);
      return -1;
   }

   return 0;

}